

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O0

cupdlp_int csr_clear(CUPDLPcsr *csr)

{
  void *in_RDI;
  
  if (in_RDI != (void *)0x0) {
    if (*(long *)((long)in_RDI + 0x10) != 0) {
      free(*(void **)((long)in_RDI + 0x10));
      *(undefined8 *)((long)in_RDI + 0x10) = 0;
    }
    if (*(long *)((long)in_RDI + 0x18) != 0) {
      free(*(void **)((long)in_RDI + 0x18));
      *(undefined8 *)((long)in_RDI + 0x18) = 0;
    }
    if (*(long *)((long)in_RDI + 0x20) != 0) {
      free(*(void **)((long)in_RDI + 0x20));
      *(undefined8 *)((long)in_RDI + 0x20) = 0;
    }
    free(in_RDI);
  }
  return 0;
}

Assistant:

cupdlp_int csr_clear(CUPDLPcsr *csr) {
  if (csr) {
#ifndef CUPDLP_CPU
    if (csr->cuda_csr != NULL) {
      CHECK_CUSPARSE(cusparseDestroySpMat(csr->cuda_csr))
    }
#endif
    if (csr->rowMatBeg) {
      CUPDLP_FREE_VEC(csr->rowMatBeg);
    }
    if (csr->rowMatIdx) {
      CUPDLP_FREE_VEC(csr->rowMatIdx);
    }
    if (csr->rowMatElem) {
      CUPDLP_FREE_VEC(csr->rowMatElem);
    }
    cupdlp_free(csr);
  }
  return 0;
}